

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

int quote_dname(char *dir)

{
  char cVar1;
  char local_128 [8];
  char fbuf [256];
  char *local_20;
  char *dp;
  char *cp;
  char *dir_local;
  
  local_20 = local_128;
  for (dp = dir; *dp != '\0'; dp = dp + 1) {
    cVar1 = *dp;
    if (((cVar1 == '\'') || (cVar1 == ';')) || (cVar1 == '>')) {
      *local_20 = '\'';
      local_20[1] = *dp;
      local_20 = local_20 + 2;
    }
    else {
      *local_20 = *dp;
      local_20 = local_20 + 1;
    }
  }
  *local_20 = '\0';
  if (local_20[-1] == '.') {
    local_20[-1] = '\'';
    *local_20 = '.';
  }
  strcpy(dir,local_128);
  return 1;
}

Assistant:

int quote_dname(char *dir)
{
  char *cp, *dp;
  char fbuf[MAXNAMLEN + 1];

  cp = dir;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  if (*(dp - 1) == '.') {
    /* Trail period should be quoted. */
    *(dp - 1) = '\'';
    *dp++ = '.';
  }

  strcpy(dir, fbuf);
  return (1);
}